

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

Vec_Int_t * Cnf_DataCollectCiSatNums(Cnf_Dat_t *pCnf,Aig_Man_t *p)

{
  Vec_Int_t *p_00;
  void *pvVar1;
  int i;
  
  p_00 = Vec_IntAlloc(p->nObjs[2]);
  for (i = 0; i < p->vCis->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vCis,i);
    Vec_IntPush(p_00,pCnf->pVarNums[*(int *)((long)pvVar1 + 0x24)]);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cnf_DataCollectCiSatNums( Cnf_Dat_t * pCnf, Aig_Man_t * p )
{
    Vec_Int_t * vCiIds;
    Aig_Obj_t * pObj;
    int i;
    vCiIds = Vec_IntAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vCiIds, pCnf->pVarNums[pObj->Id] );
    return vCiIds;
}